

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

bool __thiscall
MemoryManager::setShort(MemoryManager *this,uint32_t addr,uint16_t val,uint32_t *cycles)

{
  if ((this->memory[addr >> 0x16] != (uint8_t **)0x0) &&
     (this->memory[addr >> 0x16][addr >> 0xc & 0x3ff] != (uint8_t *)0x0)) {
    setByte(this,addr,(uint8_t)val,cycles);
    setByte(this,addr + 1,(uint8_t)(val >> 8),(uint32_t *)0x0);
    return true;
  }
  printf("Memory write to invalid addr 0x%x!\n",(ulong)addr);
  exit(-1);
}

Assistant:

bool MemoryManager::setShort(uint32_t addr, uint16_t val, uint32_t *cycles) {
//    return setNByte(addr, 2, &val, cycles);
    if (!this->addrExist(addr)) {
        printf("Memory write to invalid addr 0x%x!\n", addr);
        exit(-1);
    }
    this->setByte(addr, val & 0xff, cycles);
    this->setByte(addr + 1, (val >> 8u) & 0xff);
    return true;
}